

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O1

int luaH_next(lua_State *L,Table *t,StkId key)

{
  int *piVar1;
  uint uVar2;
  undefined8 uVar3;
  int iVar4;
  Node *pNVar5;
  Value VVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  Value VVar10;
  TValue *io;
  TKey *t1;
  int iVar11;
  int iVar12;
  int iVar13;
  
  uVar2 = key->tt_;
  VVar10.i._4_4_ = 0;
  VVar10.b = uVar2;
  if (uVar2 != 0) {
    if ((uVar2 != 0x13) ||
       (VVar10 = key->value_, VVar10.f + -0x80000001 < (code *)0xffffffff80000000)) {
      VVar10.gc = (GCObject *)0x0;
    }
    if ((VVar10.b == 0) || (t->sizearray < (uint)VVar10.b)) {
      pNVar5 = mainposition(t,key);
      t1 = &pNVar5->i_key;
      iVar4 = luaV_equalobj((lua_State *)0x0,&t1->tvk,key);
      while ((iVar4 == 0 &&
             ((((pNVar5->i_key).nk.tt_ != 10 || ((key->tt_ & 0x40) == 0)) ||
              ((t1->nk).value_.gc != (key->value_).gc))))) {
        lVar7 = (long)(pNVar5->i_key).nk.next;
        if (lVar7 == 0) {
          luaG_runerror(L,"invalid key to \'next\'");
        }
        t1 = &pNVar5[lVar7].i_key;
        iVar4 = luaV_equalobj((lua_State *)0x0,&t1->tvk,key);
        pNVar5 = pNVar5 + lVar7;
      }
      VVar10.b = t->sizearray + (int)((ulong)((long)pNVar5 - (long)t->node) >> 5) + 1;
      VVar10.i._4_4_ = 0;
    }
  }
  uVar2 = t->sizearray;
  uVar8 = VVar10.b;
  uVar9 = uVar8;
  if (uVar8 < uVar2) {
    lVar7 = (VVar10.i & 0xffffffffU) << 4;
    do {
      uVar8 = uVar8 + 1;
      if (*(int *)((long)&t->array->tt_ + lVar7) != 0) {
        VVar6.i._4_4_ = 0;
        VVar6.b = uVar8;
        key->value_ = VVar6;
        key->tt_ = 0x13;
        piVar1 = (int *)((long)&t->array->value_ + lVar7);
        iVar4 = *piVar1;
        iVar11 = piVar1[1];
        iVar12 = piVar1[2];
        iVar13 = piVar1[3];
        goto LAB_00118c16;
      }
      lVar7 = lVar7 + 0x10;
      uVar9 = uVar2;
    } while (uVar8 != uVar2);
  }
  uVar8 = 1 << (t->lsizenode & 0x1f);
  uVar9 = uVar9 - uVar2;
  if ((int)uVar9 < (int)uVar8) {
    pNVar5 = t->node;
    do {
      if (pNVar5[uVar9].i_val.tt_ != 0) {
        uVar3 = *(undefined8 *)((long)&pNVar5[uVar9].i_key + 8);
        key->value_ = pNVar5[uVar9].i_key.nk.value_;
        *(undefined8 *)&key->tt_ = uVar3;
        pNVar5 = t->node + uVar9;
        iVar4 = (pNVar5->i_val).value_.b;
        iVar11 = *(int *)((long)&(pNVar5->i_val).value_ + 4);
        iVar12 = (pNVar5->i_val).tt_;
        iVar13 = *(int *)&(pNVar5->i_val).field_0xc;
LAB_00118c16:
        key[1].value_.b = iVar4;
        *(int *)((long)&key[1].value_ + 4) = iVar11;
        key[1].tt_ = iVar12;
        *(int *)&key[1].field_0xc = iVar13;
        return 1;
      }
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  return 0;
}

Assistant:

int luaH_next(lua_State *L, Table *t, StkId key) {
    unsigned int i = findindex(L, t, key);  /* find original element */
    for (; i < t->sizearray; i++) {  /* try first array part */
        if (!ttisnil(&t->array[i])) {  /* a non-nil value? */
            setivalue(key, i + 1);
            setobj2s(L, key + 1, &t->array[i]);
            return 1;
        }
    }
    for (i -= t->sizearray; cast_int(i) < sizenode(t); i++) {  /* hash part */
        if (!ttisnil(gval(gnode(t, i)))) {  /* a non-nil value? */
            setobj2s(L, key, gkey(gnode(t, i)));
            setobj2s(L, key + 1, gval(gnode(t, i)));
            return 1;
        }
    }
    return 0;  /* no more elements */
}